

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O0

string * __thiscall
enact::AstSerialise::visitIfExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,IfExpr *expr)

{
  ostream *poVar1;
  type expr_00;
  type pBVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [376];
  IfExpr *local_20;
  IfExpr *expr_local;
  AstSerialise *this_local;
  
  local_20 = expr;
  expr_local = (IfExpr *)this;
  this_local = (AstSerialise *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,(string *)&this->m_ident);
  poVar1 = std::operator<<(poVar1,"(Expr::If ");
  expr_00 = std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::operator*
                      (&local_20->condition);
  ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  visitExpr(&local_1d8,
            &(this->
             super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ,expr_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::operator+=((string *)&this->m_ident,"    ");
  pBVar2 = std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::operator*
                     (&local_20->thenBody);
  ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  visitExpr(&local_1f8,
            &(this->
             super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ,&pBVar2->super_Expr);
  poVar1 = std::operator<<(local_198,(string *)&local_1f8);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&local_1f8);
  pBVar2 = std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::operator*
                     (&local_20->elseBody);
  ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  visitExpr(&local_218,
            &(this->
             super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ,&pBVar2->super_Expr);
  poVar1 = std::operator<<(local_198,(string *)&local_218);
  std::operator<<(poVar1,')');
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::erase((ulong)&this->m_ident,0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitIfExpr(IfExpr& expr) {
        std::stringstream s;

        s << m_ident << "(Expr::If " << visitExpr(*expr.condition) << '\n';
        m_ident += "    ";

        s << visitExpr(*expr.thenBody) << '\n';
        s << visitExpr(*expr.elseBody) << ')';

        m_ident.erase(0, 4);

        return s.str();
    }